

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  uint *puVar1;
  long lVar2;
  char *fmtStart;
  runtime_error *this;
  undefined4 in_register_0000000c;
  size_type sVar3;
  FormatArg *pFVar4;
  int numArgs_00;
  bool positionalMode;
  bool spacePadPositive;
  ostream local_1fd;
  int argIndex;
  int ntrunc;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ostream *local_1d8;
  FormatArg *local_1d0;
  string result;
  ostringstream tmpStream;
  uint auStack_190 [88];
  
  local_1f0 = CONCAT44(in_register_0000000c,numArgs);
  lVar2 = *(long *)(*(long *)out + -0x18);
  local_1e0 = *(undefined8 *)(out + lVar2 + 8);
  local_1e8 = *(undefined8 *)(out + lVar2 + 0x10);
  local_1f4 = *(undefined4 *)(out + lVar2 + 0x18);
  local_1fd = (ostream)std::ios::fill();
  positionalMode = false;
  argIndex = 0;
  local_1d8 = out;
  local_1d0 = args;
  do {
    fmtStart = printFormatStringLiteral(out,fmt);
    numArgs_00 = (int)local_1f0;
    if (*fmtStart == '\0') {
      if ((positionalMode != false) || (numArgs_00 <= argIndex)) {
        lVar2 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = local_1e8;
        *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = local_1e0;
        *(undefined4 *)(out + *(long *)(lVar2 + -0x18) + 0x18) = local_1f4;
        lVar2 = *(long *)(lVar2 + -0x18);
        std::ios::fill();
        out[lVar2 + 0xe0] = local_1fd;
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Not enough conversion specifiers in format string");
LAB_0010e9ff:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    spacePadPositive = false;
    ntrunc = -1;
    fmt = streamStateFromFormat
                    (out,&positionalMode,&spacePadPositive,&ntrunc,fmtStart,args,&argIndex,
                     numArgs_00);
    if (numArgs_00 <= argIndex) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Too many conversion specifiers in format string");
      goto LAB_0010e9ff;
    }
    pFVar4 = args + argIndex;
    if (spacePadPositive == false) {
      (*pFVar4->m_formatImpl)(out,fmtStart,fmt,ntrunc,pFVar4->m_value);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpStream);
      std::ios::copyfmt((ios *)((ostringstream *)&tmpStream + *(long *)(_tmpStream + -0x18)));
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_tmpStream + -0x18));
      *puVar1 = *puVar1 | 0x800;
      (*pFVar4->m_formatImpl)((ostream *)&tmpStream,fmtStart,fmt,ntrunc,pFVar4->m_value);
      std::__cxx11::stringbuf::str();
      args = local_1d0;
      out = local_1d8;
      for (sVar3 = 0; result._M_string_length != sVar3; sVar3 = sVar3 + 1) {
        if (result._M_dataplus._M_p[sVar3] == '+') {
          result._M_dataplus._M_p[sVar3] = ' ';
        }
      }
      std::operator<<(local_1d8,(string *)&result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpStream);
    }
    if (positionalMode == false) {
      argIndex = argIndex + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}